

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgio.c
# Opt level: O0

int msg_send(int sock,msghdr *msg)

{
  ssize_t sVar1;
  int *piVar2;
  msghdr *msg_local;
  int sock_local;
  
  if (sock < 0) {
    __assert_fail("sock >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                  ,0x85,"int msg_send(int, const struct msghdr *)");
  }
  do {
    fd_wait(sock,false);
    sVar1 = sendmsg(sock,(msghdr *)msg,0);
    if (sVar1 != -1) {
      return 0;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return -1;
}

Assistant:

static int
msg_send(int sock, const struct msghdr *msg)
{

	PJDLOG_ASSERT(sock >= 0);

	for (;;) {
		fd_wait(sock, false);
		if (sendmsg(sock, msg, 0) == -1) {
			if (errno == EINTR)
				continue;
			return (-1);
		}
		break;
	}

	return (0);
}